

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicSSOCase2::Setup(BasicSSOCase2 *this)

{
  this->m_program_ab = 0;
  this->m_program_c = 0;
  this->m_pipeline = 0;
  this->m_storage_buffer = 0;
  this->m_vao = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program_ab	 = 0;
		m_program_c		 = 0;
		m_pipeline		 = 0;
		m_storage_buffer = 0;
		m_vao			 = 0;
		return NO_ERROR;
	}